

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O1

void __thiscall BaseNode::DeleteConnection(BaseNode *this,Connection *connection)

{
  pointer *ppCVar1;
  pointer pCVar2;
  size_t __n;
  pointer __dest;
  
  __dest = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__dest != pCVar2) {
    __n = (long)pCVar2 - (long)__dest;
    do {
      __n = __n - 0x20;
      if ((((connection->input_node == __dest->input_node) &&
           (connection->input_slot == __dest->input_slot)) &&
          (connection->output_node == __dest->output_node)) &&
         (connection->output_slot == __dest->output_slot)) {
        if (__dest + 1 != pCVar2) {
          memmove(__dest,__dest + 1,__n);
        }
        ppCVar1 = &(this->connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + -1;
        return;
      }
      __dest = __dest + 1;
    } while (__dest != pCVar2);
  }
  return;
}

Assistant:

void DeleteConnection(const Connection& connection)
    {
        for (auto it = connections.begin(); it != connections.end(); ++it)
        {
            if (connection == *it)
            {
                connections.erase(it);
                break;
            }
        }
    }